

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

void on_io_open_complete(void *context,IO_OPEN_RESULT open_result)

{
  int iVar1;
  undefined1 local_58 [8];
  char to_send [41];
  XIO_HANDLE tlsio;
  IO_OPEN_RESULT open_result_local;
  void *context_local;
  
  printf("Open complete called\r\n");
  if (open_result == IO_OPEN_OK) {
    memcpy(local_58,"GET / HTTP/1.1\r\nHost: www.google.com\r\n\r\n",0x29);
    printf("Sending bytes ...\r\n");
    iVar1 = xio_send((XIO_HANDLE)context,local_58,0x29,on_send_complete,(void *)0x0);
    if (iVar1 != 0) {
      printf("Send failed\r\n");
    }
  }
  else {
    printf("Open error\r\n");
  }
  return;
}

Assistant:

static void on_io_open_complete(void* context, IO_OPEN_RESULT open_result)
{
    (void)context, (void)open_result;
    (void)printf("Open complete called\r\n");

    if (open_result == IO_OPEN_OK)
    {
        XIO_HANDLE tlsio = (XIO_HANDLE)context;
        const char to_send[] = "GET / HTTP/1.1\r\n"
            "Host: www.google.com\r\n"
            "\r\n";
        (void)printf("Sending bytes ...\r\n");
        if (xio_send(tlsio, to_send, sizeof(to_send), on_send_complete, NULL) != 0)
        {
            (void)printf("Send failed\r\n");
        }
    }
    else
    {
        (void)printf("Open error\r\n");
    }
}